

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall
wasm::WasmBinaryBuilder::visitRefAsCast(WasmBinaryBuilder *this,RefCast *curr,uint32_t code)

{
  Expression *pEVar1;
  HeapType local_40;
  Type local_38;
  HeapType local_30;
  Type local_28;
  uint32_t local_1c;
  RefCast *pRStack_18;
  uint32_t code_local;
  RefCast *curr_local;
  WasmBinaryBuilder *this_local;
  
  local_1c = code;
  pRStack_18 = curr;
  curr_local = (RefCast *)this;
  if (code == 0x58) {
    HeapType::HeapType(&local_30,func);
    wasm::Type::Type(&local_28,local_30,NonNullable);
    (pRStack_18->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression.type.id =
         local_28.id;
  }
  else {
    if (code != 0x5a) {
      handle_unreachable("unexpected ref.as*",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-binary.cpp"
                         ,0x1b34);
    }
    HeapType::HeapType(&local_40,i31);
    wasm::Type::Type(&local_38,local_40,NonNullable);
    (pRStack_18->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression.type.id =
         local_38.id;
  }
  pEVar1 = popNonVoidExpression(this);
  pRStack_18->ref = pEVar1;
  pRStack_18->safety = Safe;
  RefCast::finalize(pRStack_18);
  return;
}

Assistant:

void WasmBinaryBuilder::visitRefAsCast(RefCast* curr, uint32_t code) {
  // TODO: These instructions are deprecated. Remove them.
  switch (code) {
    case BinaryConsts::RefAsFunc:
      curr->type = Type(HeapType::func, NonNullable);
      break;
    case BinaryConsts::RefAsI31:
      curr->type = Type(HeapType::i31, NonNullable);
      break;
    default:
      WASM_UNREACHABLE("unexpected ref.as*");
  }
  curr->ref = popNonVoidExpression();
  curr->safety = RefCast::Safe;
  curr->finalize();
}